

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_int_C.c
# Opt level: O1

int test_int_C(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  char *__s;
  char *str;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int8_t y;
  char buf [256];
  ulong local_278;
  undefined1 local_26b;
  char local_26a;
  undefined1 local_269;
  undefined1 local_268;
  undefined1 local_267;
  undefined1 local_266;
  undefined1 local_265;
  undefined1 local_264;
  undefined1 local_263;
  undefined1 local_262;
  undefined1 local_261;
  undefined1 local_260;
  undefined1 local_25f;
  undefined1 local_25e;
  undefined1 local_25d;
  undefined1 local_25c;
  undefined1 local_25b;
  undefined1 local_25a;
  undefined1 local_259;
  undefined1 local_258;
  undefined1 local_257;
  undefined1 local_256;
  char local_255;
  char local_254;
  char local_253;
  char local_252;
  char local_251;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  int local_238;
  int local_234;
  uint local_230;
  uint local_22c;
  uint local_228;
  int local_224;
  int local_220;
  int local_21c;
  int local_218;
  uint local_214;
  int local_210;
  uint local_20c;
  uint local_208;
  int local_204;
  int local_200;
  int local_1fc;
  uint local_1f8;
  uint local_1f4;
  uint local_1f0;
  uint local_1ec;
  ulong local_1e8;
  uint local_1dc;
  uint local_1d8;
  uint local_1d4;
  int local_1d0;
  uint local_1cc;
  uint local_1c8;
  uint local_1c4;
  uint local_1c0;
  uint local_1bc;
  uint local_1b8;
  int local_1b4;
  int local_1b0;
  uint local_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  char local_138;
  char cStack_137;
  char cStack_136;
  char cStack_135;
  char cStack_134;
  char cStack_133;
  char cStack_132;
  char cStack_131;
  char cStack_130;
  char cStack_12f;
  char cStack_12e;
  char cStack_12d;
  char cStack_12c;
  char cStack_12b;
  char cStack_12a;
  char cStack_129;
  char local_128;
  char cStack_127;
  char cStack_126;
  char cStack_125;
  char cStack_124;
  char cStack_123;
  char cStack_122;
  
  snprintf(&local_138,0x100,"%i",0xffffffab);
  printf("C KWIML_INT_PRIi8: expected [%s], got [%s]","-85",&local_138);
  iVar9 = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138)));
  pcVar11 = ", FAILED";
  if (iVar9 == 0x35382d) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar8 = __isoc99_sscanf("-85","%hhi",&local_278);
  if (iVar8 != 1) {
    local_278 = local_278 & 0xffffffffffffff00;
  }
  uVar10 = 0;
  printf("C KWIML_INT_SCNi8: expected [%i], got [%i]",0xffffffab,(ulong)(uint)(int)(char)local_278);
  if ((char)local_278 == -0x55) {
    uVar10 = (uint)(iVar9 == 0x35382d);
    pcVar11 = ", PASSED";
  }
  else {
    pcVar11 = ", FAILED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%d",0xffffffab);
  printf("C KWIML_INT_PRId8: expected [%s], got [%s]","-85",&local_138);
  local_1ec = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138)));
  pcVar11 = ", FAILED";
  if (local_1ec == 0x35382d) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("-85","%hhd",&local_278);
  if (iVar9 != 1) {
    local_278 = local_278 & 0xffffffffffffff00;
  }
  printf("C KWIML_INT_SCNd8: expected [%d], got [%d]",0xffffffab,(ulong)(uint)(int)(char)local_278);
  local_251 = (char)local_278;
  pcVar11 = ", FAILED";
  if ((char)local_278 == -0x55) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%o",0xab);
  printf("C KWIML_INT_PRIo8: expected [%s], got [%s]","253",&local_138);
  local_1b0 = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138)));
  pcVar11 = ", FAILED";
  if (local_1b0 == 0x333532) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("253","%hho",&local_278);
  if (iVar9 != 1) {
    local_278 = local_278 & 0xffffffffffffff00;
  }
  printf("C KWIML_INT_SCNo8: expected [%o], got [%o]",0xab,local_278 & 0xff);
  local_252 = (char)local_278;
  pcVar11 = ", FAILED";
  if ((char)local_278 == -0x55) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%u",0xab);
  printf("C KWIML_INT_PRIu8: expected [%s], got [%s]","171",&local_138);
  local_1b4 = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138)));
  pcVar11 = ", FAILED";
  if (local_1b4 == 0x313731) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("171","%hhu",&local_278);
  if (iVar9 != 1) {
    local_278 = local_278 & 0xffffffffffffff00;
  }
  printf("C KWIML_INT_SCNu8: expected [%u], got [%u]",0xab,local_278 & 0xff);
  local_253 = (char)local_278;
  pcVar11 = ", FAILED";
  if ((char)local_278 == -0x55) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%x",0xab);
  printf("C KWIML_INT_PRIx8: expected [%s], got [%s]","ab",&local_138);
  local_1f8 = 0;
  bVar1 = CONCAT11(cStack_137,local_138) != 0x6261;
  local_1e8 = CONCAT71(local_1e8._1_7_,cStack_136 != '\0' || bVar1);
  pcVar11 = ", FAILED";
  if (cStack_136 == '\0' && !bVar1) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%X",0xab);
  printf("C KWIML_INT_PRIX8: expected [%s], got [%s]","AB",&local_138);
  local_22c = 0;
  bVar1 = CONCAT11(cStack_137,local_138) != 0x4241;
  local_228 = CONCAT31(local_228._1_3_,cStack_136 != '\0' || bVar1);
  pcVar11 = ", FAILED";
  if (cStack_136 == '\0' && !bVar1) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("ab","%hhx",&local_278);
  if (iVar9 != 1) {
    local_278 = local_278 & 0xffffffffffffff00;
  }
  local_1ac = uVar10;
  printf("C KWIML_INT_SCNx8: expected [%x], got [%x]",0xab,local_278 & 0xff);
  local_254 = (char)local_278;
  pcVar11 = ", FAILED";
  if ((char)local_278 == -0x55) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("AB","%hhx",&local_278);
  if (iVar9 != 1) {
    local_278 = local_278 & 0xffffffffffffff00;
  }
  printf("C KWIML_INT_SCNx8: expected [%X], got [%X]",0xab,local_278 & 0xff);
  local_255 = (char)local_278;
  __s = ", FAILED";
  pcVar11 = ", FAILED";
  if ((char)local_278 == -0x55) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%i",0xffffab00);
  printf("C KWIML_INT_PRIi16: expected [%s], got [%s]","-21760",&local_138);
  local_1fc = 0;
  bVar1 = CONCAT13(cStack_132,CONCAT12(cStack_133,CONCAT11(cStack_134,cStack_135))) != 0x303637;
  bVar2 = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138))) != 0x3731322d;
  local_268 = bVar1 || bVar2;
  if (!bVar1 && !bVar2) {
    __s = ", PASSED";
  }
  puts(__s);
  iVar9 = __isoc99_sscanf("-21760","%hi",&local_278);
  if (iVar9 != 1) {
    local_278 = local_278 & 0xffffffffffff0000;
  }
  printf("C KWIML_INT_SCNi16: expected [%i], got [%i]",0xffffab00,
         (ulong)(uint)(int)(short)(ushort)local_278);
  local_1b8 = (uint)(ushort)local_278;
  pcVar11 = ", FAILED";
  if (local_1b8 == 0xab00) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%d",0xffffab00);
  printf("C KWIML_INT_PRId16: expected [%s], got [%s]","-21760",&local_138);
  local_200 = 0;
  bVar1 = CONCAT13(cStack_132,CONCAT12(cStack_133,CONCAT11(cStack_134,cStack_135))) != 0x303637;
  bVar2 = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138))) != 0x3731322d;
  local_269 = bVar1 || bVar2;
  pcVar11 = ", FAILED";
  if (!bVar1 && !bVar2) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("-21760","%hd",&local_278);
  if (iVar9 != 1) {
    local_278 = local_278 & 0xffffffffffff0000;
  }
  printf("C KWIML_INT_SCNd16: expected [%d], got [%d]",0xffffab00,
         (ulong)(uint)(int)(short)(ushort)local_278);
  local_1bc = (uint)(ushort)local_278;
  pcVar11 = ", FAILED";
  if (local_1bc == 0xab00) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%o",0xab00);
  printf("C KWIML_INT_PRIo16: expected [%s], got [%s]","125400",&local_138);
  bVar1 = CONCAT13(cStack_132,CONCAT12(cStack_133,CONCAT11(cStack_134,cStack_135))) != 0x303034;
  bVar2 = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138))) != 0x34353231;
  local_26a = bVar1 || bVar2;
  pcVar11 = ", FAILED";
  if (!bVar1 && !bVar2) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("125400","%ho",&local_278);
  if (iVar9 != 1) {
    local_278 = local_278 & 0xffffffffffff0000;
  }
  printf("C KWIML_INT_SCNo16: expected [%o], got [%o]",0xab00,local_278 & 0xffff);
  local_1c0 = (uint)(ushort)local_278;
  pcVar11 = ", FAILED";
  if (local_1c0 == 0xab00) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%u",0xab00);
  printf("C KWIML_INT_PRIu16: expected [%s], got [%s]","43776",&local_138);
  local_204 = 0;
  bVar1 = CONCAT11(cStack_133,cStack_134) != 0x36;
  bVar2 = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138))) != 0x37373334;
  local_26b = bVar1 || bVar2;
  pcVar11 = ", FAILED";
  if (!bVar1 && !bVar2) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("43776","%hu",&local_278);
  if (iVar9 != 1) {
    local_278 = local_278 & 0xffffffffffff0000;
  }
  printf("C KWIML_INT_SCNu16: expected [%u], got [%u]",0xab00,local_278 & 0xffff);
  local_1c4 = (uint)(ushort)local_278;
  pcVar11 = ", FAILED";
  if (local_1c4 == 0xab00) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%x",0xab00);
  printf("C KWIML_INT_PRIx16: expected [%s], got [%s]","ab00",&local_138);
  local_234 = 0;
  bVar1 = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138))) != 0x30306261;
  local_256 = cStack_134 != '\0' || bVar1;
  pcVar11 = ", FAILED";
  if (cStack_134 == '\0' && !bVar1) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("ab00","%hx",&local_278);
  if (iVar9 != 1) {
    local_278 = local_278 & 0xffffffffffff0000;
  }
  printf("C KWIML_INT_SCNx16: expected [%x], got [%x]",0xab00,local_278 & 0xffff);
  local_1c8 = (uint)(ushort)local_278;
  pcVar11 = ", FAILED";
  if (local_1c8 == 0xab00) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%X",0xab00);
  printf("C KWIML_INT_PRIX16: expected [%s], got [%s]","AB00",&local_138);
  local_238 = 0;
  bVar1 = CONCAT13(cStack_135,CONCAT12(cStack_136,CONCAT11(cStack_137,local_138))) != 0x30304241;
  local_257 = cStack_134 != '\0' || bVar1;
  pcVar11 = ", FAILED";
  if (cStack_134 == '\0' && !bVar1) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("AB00","%hx",&local_278);
  if (iVar9 != 1) {
    local_278 = local_278 & 0xffffffffffff0000;
  }
  printf("C KWIML_INT_SCNx16: expected [%X], got [%X]",0xab00,local_278 & 0xffff);
  local_1cc = (uint)(ushort)local_278;
  pcVar11 = ", FAILED";
  if (local_1cc == 0xab00) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%i",0xab000000);
  printf("C KWIML_INT_PRIi32: expected [%s], got [%s]","-1426063360",&local_138);
  local_23c = 0;
  bVar1 = CONCAT13(cStack_12d,CONCAT12(cStack_12e,CONCAT11(cStack_12f,cStack_130))) != 0x303633;
  bVar2 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          != 0x333630363234312d;
  local_258 = bVar1 || bVar2;
  pcVar11 = ", FAILED";
  if (!bVar1 && !bVar2) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("-1426063360","%i",&local_278);
  if (iVar9 != 1) {
    local_278 = local_278 & 0xffffffff00000000;
  }
  printf("C KWIML_INT_SCNi32: expected [%i], got [%i]",0xab000000,local_278 & 0xffffffff);
  local_1d0 = (uint)local_278;
  pcVar11 = ", FAILED";
  if ((uint)local_278 == -0x55000000) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%d",0xab000000);
  printf("C KWIML_INT_PRId32: expected [%s], got [%s]","-1426063360",&local_138);
  local_240 = 0;
  bVar1 = CONCAT13(cStack_12d,CONCAT12(cStack_12e,CONCAT11(cStack_12f,cStack_130))) != 0x303633;
  bVar2 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          != 0x333630363234312d;
  local_259 = bVar1 || bVar2;
  pcVar11 = ", FAILED";
  if (!bVar1 && !bVar2) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("-1426063360","%d",&local_278);
  if (iVar9 != 1) {
    local_278 = local_278 & 0xffffffff00000000;
  }
  printf("C KWIML_INT_SCNd32: expected [%d], got [%d]",0xab000000,local_278 & 0xffffffff);
  local_1f0 = (uint)local_278;
  pcVar11 = ", FAILED";
  if ((uint)local_278 == 0xab000000) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%o",0xab000000);
  printf("C KWIML_INT_PRIo32: expected [%s], got [%s]","25300000000",&local_138);
  local_208 = 0;
  bVar1 = CONCAT13(cStack_12d,CONCAT12(cStack_12e,CONCAT11(cStack_12f,cStack_130))) != 0x303030;
  bVar2 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          != 0x3030303030333532;
  local_25a = bVar1 || bVar2;
  pcVar11 = ", FAILED";
  if (!bVar1 && !bVar2) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("25300000000","%o",&local_278);
  if (iVar9 != 1) {
    local_278 = local_278 & 0xffffffff00000000;
  }
  printf("C KWIML_INT_SCNo32: expected [%o], got [%o]",0xab000000,local_278 & 0xffffffff);
  local_1d4 = (uint)local_278;
  pcVar11 = ", FAILED";
  if ((uint)local_278 == 0xab000000) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%u",0xab000000);
  printf("C KWIML_INT_PRIu32: expected [%s], got [%s]","2868903936",&local_138);
  local_230 = 0;
  bVar1 = CONCAT17(cStack_12e,
                   CONCAT16(cStack_12f,
                            CONCAT15(cStack_130,
                                     CONCAT14(cStack_131,
                                              CONCAT13(cStack_132,
                                                       CONCAT12(cStack_133,
                                                                CONCAT11(cStack_134,cStack_135))))))
                  ) != 0x36333933303938;
  bVar2 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          != 0x3933303938363832;
  local_25b = bVar1 || bVar2;
  pcVar11 = ", FAILED";
  if (!bVar1 && !bVar2) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("2868903936","%u",&local_278);
  if (iVar9 != 1) {
    local_278 = local_278 & 0xffffffff00000000;
  }
  printf("C KWIML_INT_SCNu32: expected [%u], got [%u]",0xab000000,local_278 & 0xffffffff);
  local_1d8 = (uint)local_278;
  pcVar11 = ", FAILED";
  if ((uint)local_278 == 0xab000000) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%x",0xab000000);
  printf("C KWIML_INT_PRIx32: expected [%s], got [%s]","ab000000",&local_138);
  local_20c = 0;
  bVar1 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          != 0x3030303030306261;
  local_25c = cStack_130 != '\0' || bVar1;
  pcVar11 = ", FAILED";
  if (cStack_130 == '\0' && !bVar1) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("ab000000","%x",&local_278);
  if (iVar9 != 1) {
    local_278 = local_278 & 0xffffffff00000000;
  }
  printf("C KWIML_INT_SCNx32: expected [%x], got [%x]",0xab000000,local_278 & 0xffffffff);
  local_1dc = (uint)local_278;
  pcVar11 = ", FAILED";
  if ((uint)local_278 == 0xab000000) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%X",0xab000000);
  printf("C KWIML_INT_PRIX32: expected [%s], got [%s]","AB000000",&local_138);
  local_214 = 0;
  bVar1 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          != 0x3030303030304241;
  local_25d = cStack_130 != '\0' || bVar1;
  pcVar11 = ", FAILED";
  if (cStack_130 == '\0' && !bVar1) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("AB000000","%x",&local_278);
  if (iVar9 != 1) {
    local_278 = local_278 & 0xffffffff00000000;
  }
  printf("C KWIML_INT_SCNx32: expected [%X], got [%X]",0xab000000,local_278 & 0xffffffff);
  local_1f4 = (uint)local_278;
  pcVar11 = ", FAILED";
  if ((uint)local_278 == 0xab000000) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%li",0xab00000000000000);
  printf("C KWIML_INT_PRIi64: expected [%s], got [%s]","-6124895493223874560",&local_138);
  auVar44[0] = -(cStack_133 == '8');
  auVar44[1] = -(cStack_132 == '9');
  auVar44[2] = -(cStack_131 == '5');
  auVar44[3] = -(cStack_130 == '4');
  auVar44[4] = -(cStack_12f == '9');
  auVar44[5] = -(cStack_12e == '3');
  auVar44[6] = -(cStack_12d == '2');
  auVar44[7] = -(cStack_12c == '2');
  auVar44[8] = -(cStack_12b == '3');
  auVar44[9] = -(cStack_12a == '8');
  auVar44[10] = -(cStack_129 == '7');
  auVar44[0xb] = -(local_128 == '4');
  auVar44[0xc] = -(cStack_127 == '5');
  auVar44[0xd] = -(cStack_126 == '6');
  auVar44[0xe] = -(cStack_125 == '0');
  auVar44[0xf] = -(cStack_124 == '\0');
  auVar36[0] = -(local_138 == '-');
  auVar36[1] = -(cStack_137 == '6');
  auVar36[2] = -(cStack_136 == '1');
  auVar36[3] = -(cStack_135 == '2');
  auVar36[4] = -(cStack_134 == '4');
  auVar36[5] = -(cStack_133 == '8');
  auVar36[6] = -(cStack_132 == '9');
  auVar36[7] = -(cStack_131 == '5');
  auVar36[8] = -(cStack_130 == '4');
  auVar36[9] = -(cStack_12f == '9');
  auVar36[10] = -(cStack_12e == '3');
  auVar36[0xb] = -(cStack_12d == '2');
  auVar36[0xc] = -(cStack_12c == '2');
  auVar36[0xd] = -(cStack_12b == '3');
  auVar36[0xe] = -(cStack_12a == '8');
  auVar36[0xf] = -(cStack_129 == '7');
  auVar36 = auVar36 & auVar44;
  local_210 = 0;
  local_25e = (ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar36[0xf] >> 7) << 0xf) != 0xffff;
  pcVar11 = ", FAILED";
  if (!(bool)local_25e) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("-6124895493223874560","%li",&local_278);
  if (iVar9 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNi64: expected [%li], got [%li]",0xab00000000000000,local_278);
  local_140 = local_278;
  pcVar11 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%ld",0xab00000000000000);
  printf("C KWIML_INT_PRId64: expected [%s], got [%s]","-6124895493223874560",&local_138);
  local_1a8 = 0x3232333934353938;
  uStack_1a0 = 0x30363534373833;
  auVar37[0] = -(cStack_133 == '8');
  auVar37[1] = -(cStack_132 == '9');
  auVar37[2] = -(cStack_131 == '5');
  auVar37[3] = -(cStack_130 == '4');
  auVar37[4] = -(cStack_12f == '9');
  auVar37[5] = -(cStack_12e == '3');
  auVar37[6] = -(cStack_12d == '2');
  auVar37[7] = -(cStack_12c == '2');
  auVar37[8] = -(cStack_12b == '3');
  auVar37[9] = -(cStack_12a == '8');
  auVar37[10] = -(cStack_129 == '7');
  auVar37[0xb] = -(local_128 == '4');
  auVar37[0xc] = -(cStack_127 == '5');
  auVar37[0xd] = -(cStack_126 == '6');
  auVar37[0xe] = -(cStack_125 == '0');
  auVar37[0xf] = -(cStack_124 == '\0');
  local_198 = 0x353938343231362d;
  uStack_190 = 0x3738333232333934;
  auVar45[0] = -(local_138 == '-');
  auVar45[1] = -(cStack_137 == '6');
  auVar45[2] = -(cStack_136 == '1');
  auVar45[3] = -(cStack_135 == '2');
  auVar45[4] = -(cStack_134 == '4');
  auVar45[5] = -(cStack_133 == '8');
  auVar45[6] = -(cStack_132 == '9');
  auVar45[7] = -(cStack_131 == '5');
  auVar45[8] = -(cStack_130 == '4');
  auVar45[9] = -(cStack_12f == '9');
  auVar45[10] = -(cStack_12e == '3');
  auVar45[0xb] = -(cStack_12d == '2');
  auVar45[0xc] = -(cStack_12c == '2');
  auVar45[0xd] = -(cStack_12b == '3');
  auVar45[0xe] = -(cStack_12a == '8');
  auVar45[0xf] = -(cStack_129 == '7');
  auVar45 = auVar45 & auVar37;
  local_218 = 0;
  local_25f = (ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar45[0xf] >> 7) << 0xf) != 0xffff;
  pcVar11 = ", FAILED";
  if (!(bool)local_25f) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("-6124895493223874560","%ld",&local_278);
  if (iVar9 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNd64: expected [%ld], got [%ld]",0xab00000000000000,local_278);
  local_150 = local_278;
  pcVar11 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%lo",0xab00000000000000);
  printf("C KWIML_INT_PRIo64: expected [%s], got [%s]","1254000000000000000000",&local_138);
  auVar46[0] = -(cStack_131 == '0');
  auVar46[1] = -(cStack_130 == '0');
  auVar46[2] = -(cStack_12f == '0');
  auVar46[3] = -(cStack_12e == '0');
  auVar46[4] = -(cStack_12d == '0');
  auVar46[5] = -(cStack_12c == '0');
  auVar46[6] = -(cStack_12b == '0');
  auVar46[7] = -(cStack_12a == '0');
  auVar46[8] = -(cStack_129 == '0');
  auVar46[9] = -(local_128 == '0');
  auVar46[10] = -(cStack_127 == '0');
  auVar46[0xb] = -(cStack_126 == '0');
  auVar46[0xc] = -(cStack_125 == '0');
  auVar46[0xd] = -(cStack_124 == '0');
  auVar46[0xe] = -(cStack_123 == '0');
  auVar46[0xf] = -(cStack_122 == '\0');
  auVar38[0] = -(local_138 == '1');
  auVar38[1] = -(cStack_137 == '2');
  auVar38[2] = -(cStack_136 == '5');
  auVar38[3] = -(cStack_135 == '4');
  auVar38[4] = -(cStack_134 == '0');
  auVar38[5] = -(cStack_133 == '0');
  auVar38[6] = -(cStack_132 == '0');
  auVar38[7] = -(cStack_131 == '0');
  auVar38[8] = -(cStack_130 == '0');
  auVar38[9] = -(cStack_12f == '0');
  auVar38[10] = -(cStack_12e == '0');
  auVar38[0xb] = -(cStack_12d == '0');
  auVar38[0xc] = -(cStack_12c == '0');
  auVar38[0xd] = -(cStack_12b == '0');
  auVar38[0xe] = -(cStack_12a == '0');
  auVar38[0xf] = -(cStack_129 == '0');
  auVar38 = auVar38 & auVar46;
  local_244 = 0;
  local_260 = (ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar38[0xf] >> 7) << 0xf) != 0xffff;
  pcVar11 = ", FAILED";
  if (!(bool)local_260) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("1254000000000000000000","%lo",&local_278);
  if (iVar9 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNo64: expected [%lo], got [%lo]",0xab00000000000000,local_278);
  local_158 = local_278;
  pcVar11 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%lu",0xab00000000000000);
  printf("C KWIML_INT_PRIu64: expected [%s], got [%s]","12321848580485677056",&local_138);
  auVar47[0] = -(cStack_133 == '8');
  auVar47[1] = -(cStack_132 == '4');
  auVar47[2] = -(cStack_131 == '8');
  auVar47[3] = -(cStack_130 == '5');
  auVar47[4] = -(cStack_12f == '8');
  auVar47[5] = -(cStack_12e == '0');
  auVar47[6] = -(cStack_12d == '4');
  auVar47[7] = -(cStack_12c == '8');
  auVar47[8] = -(cStack_12b == '5');
  auVar47[9] = -(cStack_12a == '6');
  auVar47[10] = -(cStack_129 == '7');
  auVar47[0xb] = -(local_128 == '7');
  auVar47[0xc] = -(cStack_127 == '0');
  auVar47[0xd] = -(cStack_126 == '5');
  auVar47[0xe] = -(cStack_125 == '6');
  auVar47[0xf] = -(cStack_124 == '\0');
  auVar39[0] = -(local_138 == '1');
  auVar39[1] = -(cStack_137 == '2');
  auVar39[2] = -(cStack_136 == '3');
  auVar39[3] = -(cStack_135 == '2');
  auVar39[4] = -(cStack_134 == '1');
  auVar39[5] = -(cStack_133 == '8');
  auVar39[6] = -(cStack_132 == '4');
  auVar39[7] = -(cStack_131 == '8');
  auVar39[8] = -(cStack_130 == '5');
  auVar39[9] = -(cStack_12f == '8');
  auVar39[10] = -(cStack_12e == '0');
  auVar39[0xb] = -(cStack_12d == '4');
  auVar39[0xc] = -(cStack_12c == '8');
  auVar39[0xd] = -(cStack_12b == '5');
  auVar39[0xe] = -(cStack_12a == '6');
  auVar39[0xf] = -(cStack_129 == '7');
  auVar39 = auVar39 & auVar47;
  local_248 = 0;
  local_261 = (ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar39[0xf] >> 7) << 0xf) != 0xffff;
  pcVar11 = ", FAILED";
  if (!(bool)local_261) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("12321848580485677056","%lu",&local_278);
  if (iVar9 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNu64: expected [%lu], got [%lu]",0xab00000000000000,local_278);
  local_148 = local_278;
  pcVar11 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%lx",0xab00000000000000);
  printf("C KWIML_INT_PRIx64: expected [%s], got [%s]","ab00000000000000",&local_138);
  local_21c = 0;
  bVar2 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          != 0x3030303030306261;
  bVar1 = CONCAT17(cStack_129,
                   CONCAT16(cStack_12a,
                            CONCAT15(cStack_12b,
                                     CONCAT14(cStack_12c,
                                              CONCAT13(cStack_12d,
                                                       CONCAT12(cStack_12e,
                                                                CONCAT11(cStack_12f,cStack_130))))))
                  ) != 0x3030303030303030;
  local_262 = (local_128 != '\0' || bVar2) || bVar1;
  pcVar11 = ", FAILED";
  if ((local_128 == '\0' && !bVar2) && !bVar1) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%lX",0xab00000000000000);
  printf("C KWIML_INT_PRIX64: expected [%s], got [%s]","AB00000000000000",&local_138);
  local_220 = 0;
  bVar2 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          != 0x3030303030304241;
  bVar1 = CONCAT17(cStack_129,
                   CONCAT16(cStack_12a,
                            CONCAT15(cStack_12b,
                                     CONCAT14(cStack_12c,
                                              CONCAT13(cStack_12d,
                                                       CONCAT12(cStack_12e,
                                                                CONCAT11(cStack_12f,cStack_130))))))
                  ) != 0x3030303030303030;
  local_263 = (local_128 != '\0' || bVar2) || bVar1;
  pcVar11 = ", FAILED";
  if ((local_128 == '\0' && !bVar2) && !bVar1) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("ab00000000000000","%lx",&local_278);
  if (iVar9 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNx64: expected [%lx], got [%lx]",0xab00000000000000,local_278);
  local_168 = local_278;
  pcVar11 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("AB00000000000000","%lx",&local_278);
  if (iVar9 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNx64: expected [%lX], got [%lX]",0xab00000000000000,local_278);
  local_170 = local_278;
  pcVar11 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%li",0xab00000000000000);
  printf("C KWIML_INT_PRIiPTR: expected [%s], got [%s]","-6124895493223874560",&local_138);
  auVar40[0] = -(cStack_133 == (char)local_1a8);
  auVar40[1] = -(cStack_132 == local_1a8._1_1_);
  auVar40[2] = -(cStack_131 == local_1a8._2_1_);
  auVar40[3] = -(cStack_130 == local_1a8._3_1_);
  auVar40[4] = -(cStack_12f == local_1a8._4_1_);
  auVar40[5] = -(cStack_12e == local_1a8._5_1_);
  auVar40[6] = -(cStack_12d == local_1a8._6_1_);
  auVar40[7] = -(cStack_12c == local_1a8._7_1_);
  auVar40[8] = -(cStack_12b == (char)uStack_1a0);
  auVar40[9] = -(cStack_12a == uStack_1a0._1_1_);
  auVar40[10] = -(cStack_129 == uStack_1a0._2_1_);
  auVar40[0xb] = -(local_128 == uStack_1a0._3_1_);
  auVar40[0xc] = -(cStack_127 == uStack_1a0._4_1_);
  auVar40[0xd] = -(cStack_126 == uStack_1a0._5_1_);
  auVar40[0xe] = -(cStack_125 == uStack_1a0._6_1_);
  auVar40[0xf] = -(cStack_124 == uStack_1a0._7_1_);
  auVar48[0] = -(local_138 == (char)local_198);
  auVar48[1] = -(cStack_137 == local_198._1_1_);
  auVar48[2] = -(cStack_136 == local_198._2_1_);
  auVar48[3] = -(cStack_135 == local_198._3_1_);
  auVar48[4] = -(cStack_134 == local_198._4_1_);
  auVar48[5] = -(cStack_133 == local_198._5_1_);
  auVar48[6] = -(cStack_132 == local_198._6_1_);
  auVar48[7] = -(cStack_131 == local_198._7_1_);
  auVar48[8] = -(cStack_130 == (char)uStack_190);
  auVar48[9] = -(cStack_12f == uStack_190._1_1_);
  auVar48[10] = -(cStack_12e == uStack_190._2_1_);
  auVar48[0xb] = -(cStack_12d == uStack_190._3_1_);
  auVar48[0xc] = -(cStack_12c == uStack_190._4_1_);
  auVar48[0xd] = -(cStack_12b == uStack_190._5_1_);
  auVar48[0xe] = -(cStack_12a == uStack_190._6_1_);
  auVar48[0xf] = -(cStack_129 == uStack_190._7_1_);
  auVar48 = auVar48 & auVar40;
  local_24c = 0;
  local_264 = (ushort)((ushort)(SUB161(auVar48 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar48[0xf] >> 7) << 0xf) != 0xffff;
  pcVar11 = ", FAILED";
  if (!(bool)local_264) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("-6124895493223874560","%li",&local_278);
  if (iVar9 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNiPTR: expected [%li], got [%li]",0xab00000000000000,local_278);
  local_178 = local_278;
  pcVar11 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%ld",0xab00000000000000);
  printf("C KWIML_INT_PRIdPTR: expected [%s], got [%s]","-6124895493223874560",&local_138);
  auVar49[0] = -((char)local_1a8 == cStack_133);
  auVar49[1] = -(local_1a8._1_1_ == cStack_132);
  auVar49[2] = -(local_1a8._2_1_ == cStack_131);
  auVar49[3] = -(local_1a8._3_1_ == cStack_130);
  auVar49[4] = -(local_1a8._4_1_ == cStack_12f);
  auVar49[5] = -(local_1a8._5_1_ == cStack_12e);
  auVar49[6] = -(local_1a8._6_1_ == cStack_12d);
  auVar49[7] = -(local_1a8._7_1_ == cStack_12c);
  auVar49[8] = -((char)uStack_1a0 == cStack_12b);
  auVar49[9] = -(uStack_1a0._1_1_ == cStack_12a);
  auVar49[10] = -(uStack_1a0._2_1_ == cStack_129);
  auVar49[0xb] = -(uStack_1a0._3_1_ == local_128);
  auVar49[0xc] = -(uStack_1a0._4_1_ == cStack_127);
  auVar49[0xd] = -(uStack_1a0._5_1_ == cStack_126);
  auVar49[0xe] = -(uStack_1a0._6_1_ == cStack_125);
  auVar49[0xf] = -(uStack_1a0._7_1_ == cStack_124);
  auVar41[0] = -((char)local_198 == local_138);
  auVar41[1] = -(local_198._1_1_ == cStack_137);
  auVar41[2] = -(local_198._2_1_ == cStack_136);
  auVar41[3] = -(local_198._3_1_ == cStack_135);
  auVar41[4] = -(local_198._4_1_ == cStack_134);
  auVar41[5] = -(local_198._5_1_ == cStack_133);
  auVar41[6] = -(local_198._6_1_ == cStack_132);
  auVar41[7] = -(local_198._7_1_ == cStack_131);
  auVar41[8] = -((char)uStack_190 == cStack_130);
  auVar41[9] = -(uStack_190._1_1_ == cStack_12f);
  auVar41[10] = -(uStack_190._2_1_ == cStack_12e);
  auVar41[0xb] = -(uStack_190._3_1_ == cStack_12d);
  auVar41[0xc] = -(uStack_190._4_1_ == cStack_12c);
  auVar41[0xd] = -(uStack_190._5_1_ == cStack_12b);
  auVar41[0xe] = -(uStack_190._6_1_ == cStack_12a);
  auVar41[0xf] = -(uStack_190._7_1_ == cStack_129);
  auVar41 = auVar41 & auVar49;
  local_250 = 0;
  local_265 = (ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar41[0xf] >> 7) << 0xf) != 0xffff;
  pcVar11 = ", FAILED";
  if (!(bool)local_265) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("-6124895493223874560","%ld",&local_278);
  if (iVar9 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNdPTR: expected [%ld], got [%ld]",0xab00000000000000,local_278);
  local_160 = local_278;
  pcVar11 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%lo",0xab00000000000000);
  printf("C KWIML_INT_PRIoPTR: expected [%s], got [%s]","1254000000000000000000",&local_138);
  auVar50[0] = -(cStack_131 == '0');
  auVar50[1] = -(cStack_130 == '0');
  auVar50[2] = -(cStack_12f == '0');
  auVar50[3] = -(cStack_12e == '0');
  auVar50[4] = -(cStack_12d == '0');
  auVar50[5] = -(cStack_12c == '0');
  auVar50[6] = -(cStack_12b == '0');
  auVar50[7] = -(cStack_12a == '0');
  auVar50[8] = -(cStack_129 == '0');
  auVar50[9] = -(local_128 == '0');
  auVar50[10] = -(cStack_127 == '0');
  auVar50[0xb] = -(cStack_126 == '0');
  auVar50[0xc] = -(cStack_125 == '0');
  auVar50[0xd] = -(cStack_124 == '0');
  auVar50[0xe] = -(cStack_123 == '0');
  auVar50[0xf] = -(cStack_122 == '\0');
  auVar42[0] = -(local_138 == '1');
  auVar42[1] = -(cStack_137 == '2');
  auVar42[2] = -(cStack_136 == '5');
  auVar42[3] = -(cStack_135 == '4');
  auVar42[4] = -(cStack_134 == '0');
  auVar42[5] = -(cStack_133 == '0');
  auVar42[6] = -(cStack_132 == '0');
  auVar42[7] = -(cStack_131 == '0');
  auVar42[8] = -(cStack_130 == '0');
  auVar42[9] = -(cStack_12f == '0');
  auVar42[10] = -(cStack_12e == '0');
  auVar42[0xb] = -(cStack_12d == '0');
  auVar42[0xc] = -(cStack_12c == '0');
  auVar42[0xd] = -(cStack_12b == '0');
  auVar42[0xe] = -(cStack_12a == '0');
  auVar42[0xf] = -(cStack_129 == '0');
  auVar42 = auVar42 & auVar50;
  local_198 = local_198 & 0xffffffff00000000;
  local_266 = (ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar42[0xf] >> 7) << 0xf) != 0xffff;
  pcVar11 = ", FAILED";
  if (!(bool)local_266) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("1254000000000000000000","%lo",&local_278);
  if (iVar9 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNoPTR: expected [%lo], got [%lo]",0xab00000000000000,local_278);
  local_180 = local_278;
  pcVar11 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%lu",0xab00000000000000);
  printf("C KWIML_INT_PRIuPTR: expected [%s], got [%s]","12321848580485677056",&local_138);
  auVar51[0] = -(cStack_133 == '8');
  auVar51[1] = -(cStack_132 == '4');
  auVar51[2] = -(cStack_131 == '8');
  auVar51[3] = -(cStack_130 == '5');
  auVar51[4] = -(cStack_12f == '8');
  auVar51[5] = -(cStack_12e == '0');
  auVar51[6] = -(cStack_12d == '4');
  auVar51[7] = -(cStack_12c == '8');
  auVar51[8] = -(cStack_12b == '5');
  auVar51[9] = -(cStack_12a == '6');
  auVar51[10] = -(cStack_129 == '7');
  auVar51[0xb] = -(local_128 == '7');
  auVar51[0xc] = -(cStack_127 == '0');
  auVar51[0xd] = -(cStack_126 == '5');
  auVar51[0xe] = -(cStack_125 == '6');
  auVar51[0xf] = -(cStack_124 == '\0');
  auVar43[0] = -(local_138 == '1');
  auVar43[1] = -(cStack_137 == '2');
  auVar43[2] = -(cStack_136 == '3');
  auVar43[3] = -(cStack_135 == '2');
  auVar43[4] = -(cStack_134 == '1');
  auVar43[5] = -(cStack_133 == '8');
  auVar43[6] = -(cStack_132 == '4');
  auVar43[7] = -(cStack_131 == '8');
  auVar43[8] = -(cStack_130 == '5');
  auVar43[9] = -(cStack_12f == '8');
  auVar43[10] = -(cStack_12e == '0');
  auVar43[0xb] = -(cStack_12d == '4');
  auVar43[0xc] = -(cStack_12c == '8');
  auVar43[0xd] = -(cStack_12b == '5');
  auVar43[0xe] = -(cStack_12a == '6');
  auVar43[0xf] = -(cStack_129 == '7');
  auVar43 = auVar43 & auVar51;
  local_1a8 = local_1a8 & 0xffffffff00000000;
  local_267 = (ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar43[0xf] >> 7) << 0xf) != 0xffff;
  pcVar11 = ", FAILED";
  if (!(bool)local_267) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("12321848580485677056","%lu",&local_278);
  if (iVar9 != 1) {
    local_278 = 0;
  }
  printf("C KWIML_INT_SCNuPTR: expected [%lu], got [%lu]",0xab00000000000000,local_278);
  local_188 = local_278;
  pcVar11 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%lx",0xab00000000000000);
  printf("C KWIML_INT_PRIxPTR: expected [%s], got [%s]","ab00000000000000",&local_138);
  local_224 = 0;
  bVar2 = local_128 != '\0';
  bVar3 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          != 0x3030303030306261;
  bVar1 = CONCAT17(cStack_129,
                   CONCAT16(cStack_12a,
                            CONCAT15(cStack_12b,
                                     CONCAT14(cStack_12c,
                                              CONCAT13(cStack_12d,
                                                       CONCAT12(cStack_12e,
                                                                CONCAT11(cStack_12f,cStack_130))))))
                  ) != 0x3030303030303030;
  pcVar11 = ", FAILED";
  if ((!bVar2 && !bVar3) && !bVar1) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("ab00000000000000","%lx",&local_278);
  cVar7 = local_26a;
  if (iVar9 != 1) {
    local_278 = 0;
  }
  local_1f8 = CONCAT31((int3)(local_1f8 >> 8),(undefined1)local_1e8);
  local_22c = CONCAT31((int3)(local_22c >> 8),(undefined1)local_228);
  local_1fc = CONCAT31((int3)((uint)local_1fc >> 8),local_268);
  local_200 = CONCAT31((int3)((uint)local_200 >> 8),local_269);
  local_204 = CONCAT31((int3)((uint)local_204 >> 8),local_26b);
  local_234 = CONCAT31((int3)((uint)local_234 >> 8),local_256);
  local_238 = CONCAT31((int3)((uint)local_238 >> 8),local_257);
  local_23c = CONCAT31((int3)((uint)local_23c >> 8),local_258);
  local_240 = CONCAT31((int3)((uint)local_240 >> 8),local_259);
  local_208 = CONCAT31((int3)(local_208 >> 8),local_25a);
  local_230 = CONCAT31((int3)(local_230 >> 8),local_25b);
  local_20c = CONCAT31((int3)(local_20c >> 8),local_25c);
  local_214 = CONCAT31((int3)(local_214 >> 8),local_25d);
  local_210 = CONCAT31((int3)((uint)local_210 >> 8),local_25e);
  local_218 = CONCAT31((int3)((uint)local_218 >> 8),local_25f);
  local_244 = CONCAT31((int3)((uint)local_244 >> 8),local_260);
  local_248 = CONCAT31((int3)((uint)local_248 >> 8),local_261);
  local_21c = CONCAT31((int3)((uint)local_21c >> 8),local_262);
  local_220 = CONCAT31((int3)((uint)local_220 >> 8),local_263);
  local_24c = CONCAT31((int3)((uint)local_24c >> 8),local_264);
  local_250 = CONCAT31((int3)((uint)local_250 >> 8),local_265);
  local_198 = CONCAT44(local_198._4_4_,CONCAT31((int3)(local_198 >> 8),local_266));
  local_1a8 = CONCAT44(local_1a8._4_4_,CONCAT31((int3)(local_1a8 >> 8),local_267));
  local_224 = CONCAT31((int3)((uint)local_224 >> 8),(bVar2 || bVar3) || bVar1);
  printf("C KWIML_INT_SCNxPTR: expected [%lx], got [%lx]",0xab00000000000000,local_278);
  local_1e8 = local_278;
  pcVar11 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  snprintf(&local_138,0x100,"%lX",0xab00000000000000);
  printf("C KWIML_INT_PRIXPTR: expected [%s], got [%s]","AB00000000000000",&local_138);
  bVar2 = CONCAT17(cStack_131,
                   CONCAT16(cStack_132,
                            CONCAT15(cStack_133,
                                     CONCAT14(cStack_134,
                                              CONCAT13(cStack_135,
                                                       CONCAT12(cStack_136,
                                                                CONCAT11(cStack_137,local_138)))))))
          != 0x3030303030304241;
  bVar1 = CONCAT17(cStack_129,
                   CONCAT16(cStack_12a,
                            CONCAT15(cStack_12b,
                                     CONCAT14(cStack_12c,
                                              CONCAT13(cStack_12d,
                                                       CONCAT12(cStack_12e,
                                                                CONCAT11(cStack_12f,cStack_130))))))
                  ) != 0x3030303030303030;
  local_228 = (uint)((local_128 != '\0' || bVar2) || bVar1);
  pcVar11 = ", FAILED";
  if ((local_128 == '\0' && !bVar2) && !bVar1) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  iVar9 = __isoc99_sscanf("AB00000000000000","%lx",&local_278);
  if (iVar9 != 1) {
    local_278 = 0;
  }
  local_188 = local_188 ^ 0xab00000000000000;
  local_180 = local_180 ^ 0xab00000000000000;
  bVar12 = local_250 == 0;
  local_250 = CONCAT31(local_250._1_3_,bVar12);
  bVar13 = local_178 == 0xab00000000000000;
  bVar14 = local_24c == 0;
  local_24c = CONCAT31(local_24c._1_3_,bVar14);
  bVar15 = local_170 == 0xab00000000000000;
  bVar16 = local_168 != 0xab00000000000000;
  bVar17 = local_248 == 0;
  local_248 = CONCAT31(local_248._1_3_,bVar17);
  bVar18 = local_158 == 0xab00000000000000;
  bVar19 = local_244 == 0;
  local_244 = CONCAT31(local_244._1_3_,bVar19);
  bVar20 = local_150 == 0xab00000000000000;
  bVar21 = local_140 != 0xab00000000000000;
  local_230 = local_230 | local_208 | local_20c | local_1d4 ^ 0xab000000 | local_1d8 ^ 0xab000000 |
              local_214 | local_1dc ^ 0xab000000;
  local_1f4 = local_1f4 ^ 0xab000000;
  local_1f0 = local_1f0 ^ 0xab000000;
  bVar22 = local_240 != 0;
  bVar23 = local_1d0 == -0x55000000;
  local_240 = CONCAT31(local_240._1_3_,bVar23);
  bVar24 = local_23c != 0;
  bVar25 = (short)local_1cc == -0x5500;
  local_23c = CONCAT31(local_23c._1_3_,bVar25);
  bVar26 = local_238 != 0;
  bVar27 = (short)local_1c8 == -0x5500;
  local_238 = CONCAT31(local_238._1_3_,bVar27);
  bVar28 = local_234 == 0;
  local_234 = CONCAT31(local_234._1_3_,bVar28);
  bVar29 = (short)local_1c4 != -0x5500;
  bVar30 = local_204 != 0;
  bVar31 = (short)local_1c0 != -0x5500;
  bVar32 = (short)local_1bc != -0x5500;
  bVar33 = local_200 != 0;
  bVar34 = (short)local_1b8 != -0x5500;
  bVar35 = local_1fc != 0;
  local_22c = local_22c | local_1f8;
  local_1ec = local_1ec ^ 0x35382d;
  bVar1 = local_254 != -0x55;
  bVar2 = local_255 != -0x55;
  bVar3 = local_218 != 0;
  bVar4 = local_210 != 0;
  bVar5 = local_220 != 0;
  bVar6 = local_21c != 0;
  local_26b = bVar20;
  local_26a = bVar18;
  local_269 = bVar15;
  local_268 = bVar13;
  printf("C KWIML_INT_SCNxPTR: expected [%lX], got [%lX]",0xab00000000000000,local_278);
  uVar10 = local_1ac;
  if (local_253 != -0x55) {
    uVar10 = 0;
  }
  if (local_1b4 != 0x313731) {
    uVar10 = 0;
  }
  if (local_252 != -0x55) {
    uVar10 = 0;
  }
  if (local_1b0 != 0x333532) {
    uVar10 = 0;
  }
  if (local_251 != -0x55) {
    uVar10 = 0;
  }
  local_22c = local_22c | local_1ec;
  if (local_22c != 0) {
    uVar10 = 0;
  }
  if (((cVar7 != '\0' || bVar31) || bVar30) ||
      ((bVar33 || bVar32) || (((bVar1 || bVar2) || bVar34) || bVar35))) {
    uVar10 = 0;
  }
  if (((bVar24 || !bVar23) || bVar22) || ((bVar26 || !bVar25) || ((bVar29 || !bVar27) || !bVar28)))
  {
    uVar10 = 0;
  }
  if ((local_1f0 != 0 || local_230 != 0) || local_1f4 != 0) {
    uVar10 = 0;
  }
  if (((((bVar21 || !bVar20) || !bVar19) || !bVar18) || (bVar3 || bVar4)) || !bVar17) {
    uVar10 = 0;
  }
  if (local_148 != 0xab00000000000000) {
    uVar10 = 0;
  }
  if (((((bVar16 || !bVar15) || (bVar5 || bVar6)) || !bVar13) || !bVar14) || !bVar12) {
    uVar10 = 0;
  }
  if (local_160 != 0xab00000000000000) {
    uVar10 = 0;
  }
  if ((int)local_1a8 != 0 || (int)local_198 != 0) {
    uVar10 = 0;
  }
  if (local_180 != 0 || local_188 != 0) {
    uVar10 = 0;
  }
  if (local_224 != 0) {
    uVar10 = 0;
  }
  if (local_1e8 != 0xab00000000000000) {
    uVar10 = 0;
  }
  if (local_228 != 0) {
    uVar10 = 0;
  }
  if (local_278 != 0xab00000000000000) {
    uVar10 = 0;
  }
  pcVar11 = ", FAILED";
  if (local_278 == 0xab00000000000000) {
    pcVar11 = ", PASSED";
  }
  puts(pcVar11);
  printf("C KWIML_INT_INT8_C: expression [%i], literal [%i]",0xffffffab,0xffffffab);
  puts(", PASSED");
  printf("C KWIML_INT_UINT8_C: expression [%u], literal [%u]",0xab,0xab);
  puts(", PASSED");
  printf("C KWIML_INT_INT16_C: expression [%i], literal [%i]",0xffffab00,0xffffab00);
  puts(", PASSED");
  printf("C KWIML_INT_UINT16_C: expression [%u], literal [%u]",0xab00,0xab00);
  puts(", PASSED");
  printf("C KWIML_INT_INT32_C: expression [%i], literal [%i]",0xab000000,0xab000000);
  puts(", PASSED");
  printf("C KWIML_INT_UINT32_C: expression [%u], literal [%u]",0xab000000,0xab000000);
  puts(", PASSED");
  printf("C KWIML_INT_INT64_C: expression [%li], literal [%li]",0xab00000000000000,
         0xab00000000000000);
  puts(", PASSED");
  printf("C KWIML_INT_UINT64_C: expression [%lu], literal [%lu]",0xab00000000000000,
         0xab00000000000000);
  puts(", PASSED");
  return uVar10;
}

Assistant:

int test_int_C(void)
{
  if(!test_int_format())
    {
    return 0;
    }
  return 1;
}